

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O3

void __thiscall
osqp::anon_unknown_0::OsqpTest_GetAndUpdateCheckTermination_Test::
~OsqpTest_GetAndUpdateCheckTermination_Test(OsqpTest_GetAndUpdateCheckTermination_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(OsqpTest, GetAndUpdateCheckTermination) {
  OsqpSettings settings;
  settings.check_termination = 12;

  OsqpSolver solver;
  ASSERT_TRUE(solver.Init(GetToyProblem(), settings).ok());
  ASSERT_EQ(solver.Solve(), OsqpExitCode::kOptimal);

  {
    const auto check_termination = solver.GetCheckTermination();
    ASSERT_TRUE(check_termination.ok());
    EXPECT_EQ(*check_termination, 12);
  }

  ASSERT_TRUE(solver.UpdateCheckTermination(13).ok());
  {
    const auto check_termination = solver.GetCheckTermination();
    ASSERT_TRUE(check_termination.ok());
    EXPECT_EQ(*check_termination, 13);
  }
}